

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlHandle __thiscall despot::util::tinyxml::TiXmlHandle::FirstChildElement(TiXmlHandle *this)

{
  TiXmlElement *_node;
  long *in_RSI;
  TiXmlElement *child;
  TiXmlHandle *this_local;
  
  if ((*in_RSI == 0) ||
     (_node = TiXmlNode::FirstChildElement((TiXmlNode *)*in_RSI), _node == (TiXmlElement *)0x0)) {
    TiXmlHandle(this,(TiXmlNode *)0x0);
  }
  else {
    TiXmlHandle(this,&_node->super_TiXmlNode);
  }
  return (TiXmlHandle)(TiXmlNode *)this;
}

Assistant:

TiXmlHandle TiXmlHandle::FirstChildElement() const {
	if (node) {
		TiXmlElement* child = node->FirstChildElement();
		if (child)
			return TiXmlHandle(child);
	}
	return TiXmlHandle(0);
}